

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

string * __thiscall Object::asString_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{\n",(allocator<char> *)&local_30);
  Environment::toString_abi_cxx11_(&local_30,&this->members,true);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Object::asString() {
    std::string result = "{\n";
    result += members.toString(true);
    result += "}";
    return result;
}